

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,Context *context,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *shaderOp,ShaderDataSpec *spec)

{
  pointer pcVar1;
  undefined3 uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  ShaderDataSpec *pSVar6;
  ShaderDataSpec *pSVar7;
  byte bVar8;
  
  bVar8 = 0;
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_02177b80;
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,caseName,description,isVertexCase,
             &(this->m_evaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_02177b80;
  pSVar6 = spec;
  pSVar7 = &this->m_spec;
  for (lVar5 = 0x1a; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar2 = *(undefined3 *)&(pSVar6->resultScale).field_0x1;
    (pSVar7->resultScale).m_isConstant = (pSVar6->resultScale).m_isConstant;
    *(undefined3 *)&(pSVar7->resultScale).field_0x1 = uVar2;
    pSVar6 = (ShaderDataSpec *)((long)pSVar6 + ((ulong)bVar8 * -2 + 1) * 4);
    pSVar7 = (ShaderDataSpec *)((long)pSVar7 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  (this->m_shaderOp)._M_dataplus._M_p = (pointer)&(this->m_shaderOp).field_2;
  pcVar1 = (shaderOp->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_shaderOp,pcVar1,pcVar1 + shaderOp->_M_string_length);
  iVar3 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  iVar4 = glu::getDataTypeScalarSize(spec->output);
  deqp::gls::ShaderEvaluator::ShaderEvaluator(&(this->m_evaluator).super_ShaderEvaluator);
  (this->m_evaluator).super_ShaderEvaluator._vptr_ShaderEvaluator =
       (_func_int **)&PTR__ShaderEvaluator_02177f80;
  (this->m_evaluator).m_gl = (Functions *)CONCAT44(extraout_var,iVar3);
  (this->m_evaluator).m_shaderType = (uint)!isVertexCase;
  (this->m_evaluator).m_evalFunc = evalFunc;
  (this->m_evaluator).m_scale = spec->referenceScale;
  (this->m_evaluator).m_bias = spec->referenceBias;
  (this->m_evaluator).m_resultScalarSize = iVar4;
  (this->m_evaluator).m_areScaleAndBiasEvaluated = false;
  (this->m_evaluator).m_evaluatedScale = -1.0;
  (this->m_evaluator).m_evaluatedBias = -1.0;
  return;
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, const string& shaderOp, const ShaderDataSpec& spec)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), caseName, description, isVertexCase, m_evaluator)
	, m_spec			(spec)
	, m_shaderOp		(shaderOp)
	, m_evaluator		(m_renderCtx.getFunctions(), isVertexCase ? SHADERTYPE_VERTEX : SHADERTYPE_FRAGMENT, evalFunc, spec.referenceScale, spec.referenceBias, getDataTypeScalarSize(spec.output))
{
}